

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_filter.cpp
# Opt level: O2

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalFilter::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalFilter *this)

{
  reference this_00;
  pointer pLVar1;
  _Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_> local_30;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&(this->super_LogicalOperator).children,0);
  pLVar1 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(this_00);
  (*pLVar1->_vptr_LogicalOperator[2])(&local_30,pLVar1);
  LogicalOperator::MapBindings
            (__return_storage_ptr__,(vector<duckdb::ColumnBinding,_true> *)&local_30,
             &this->projection_map);
  ::std::_Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::~_Vector_base
            (&local_30);
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalFilter::GetColumnBindings() {
	return MapBindings(children[0]->GetColumnBindings(), projection_map);
}